

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::verifySourceIter(CopyImageTest *this)

{
  ostringstream *this_00;
  TestLog *log;
  State *rng;
  ObjectWrapper *pOVar1;
  ScopedLogSection sourceSection;
  string local_1d0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b0._0_8_ = local_1b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Source image verify.","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Source image verify.","");
  tcu::ScopedLogSection::ScopedLogSection(&sourceSection,log,(string *)local_1b0,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  rng = this->m_state;
  pOVar1 = rng->srcImage;
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verifying source image.",0x17);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  render((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
         ((this->super_TestCase).m_context)->m_renderCtx,&this->m_state->textureRenderer,
         &rng->results,&rng->rng,pOVar1->m_object,&rng->srcImageLevels,&this->m_srcImageInfo,
         VERIFY_COMPARE_REFERENCE);
  tcu::TestLog::endSection(sourceSection.m_log);
  return;
}

Assistant:

void CopyImageTest::verifySourceIter (void)
{
	TestLog&						log					= m_testCtx.getLog();
	const tcu::ScopedLogSection		sourceSection		(log, "Source image verify.", "Source image verify.");

	de::Random&						rng					= m_state->rng;
	tcu::ResultCollector&			results				= m_state->results;
	glu::ObjectWrapper&				srcImage			= *m_state->srcImage;
	vector<ArrayBuffer<deUint8> >&	srcImageLevels		= m_state->srcImageLevels;

	log << TestLog::Message << "Verifying source image." << TestLog::EndMessage;

	render(m_testCtx, m_context.getRenderContext(), m_state->textureRenderer, results, rng, *srcImage, srcImageLevels, m_srcImageInfo, VERIFY_COMPARE_REFERENCE);
}